

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall EventHandler::OnPlayerJoin(EventHandler *this,IPlayer *player)

{
  CmdHandl *pCVar1;
  function<void_(rage::IPlayer_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_&)>
  local_70;
  allocator<char16_t> local_39;
  u16string local_38 [32];
  IPlayer *local_18;
  IPlayer *player_local;
  EventHandler *this_local;
  
  pCVar1 = cmdh;
  local_18 = player;
  player_local = (IPlayer *)this;
  std::allocator<char16_t>::allocator(&local_39);
  std::__cxx11::u16string::u16string(local_38,L"help",&local_39);
  std::function<void(rage::IPlayer*,std::__cxx11::u16string&)>::
  function<void(&)(rage::IPlayer*,std::__cxx11::u16string&),void>
            ((function<void(rage::IPlayer*,std::__cxx11::u16string&)> *)&local_70,CmdList::help);
  (**pCVar1->_vptr_CmdHandl)(pCVar1,local_38,&local_70);
  std::
  function<void_(rage::IPlayer_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_&)>
  ::~function(&local_70);
  std::__cxx11::u16string::~u16string(local_38);
  std::allocator<char16_t>::~allocator(&local_39);
  return;
}

Assistant:

void EventHandler::OnPlayerJoin( rage::IPlayer *player)
{
	cmdh->addCommand(u"help", CmdList::help);
}